

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O0

void __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenerateFinishStructBuffer
          (KotlinKMPGenerator *this,StructDef *struct_def,string *identifier,CodeWriter *writer,
          IDLOptions *options)

{
  long lVar1;
  anon_class_16_2_22b92921 local_1d0;
  function<void_()> local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  undefined1 local_128 [8];
  string method_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> gen_type;
  bool local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id;
  IDLOptions *options_local;
  CodeWriter *writer_local;
  string *identifier_local;
  StructDef *struct_def_local;
  KotlinKMPGenerator *this_local;
  
  id.field_2._8_8_ = options;
  lVar1 = std::__cxx11::string::length();
  gen_type.field_2._M_local_buf[10] = '\0';
  if (lVar1 == 0) {
    std::allocator<char>::allocator();
    gen_type.field_2._M_local_buf[10] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,"",(allocator<char> *)(gen_type.field_2._M_local_buf + 0xb));
  }
  else {
    std::operator+(&local_70,", \"",identifier);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_70,"\"");
  }
  local_71 = lVar1 != 0;
  if ((gen_type.field_2._M_local_buf[10] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(gen_type.field_2._M_local_buf + 0xb));
  }
  if (local_71) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  Namer::Type((string *)((long)&params.field_2 + 8),&(this->namer_).super_Namer,(string *)struct_def
             );
  std::operator+(&local_c8,"Offset<",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&params.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 &local_c8,">");
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)(params.field_2._M_local_buf + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&method_name.field_2 + 8),"builder: FlatBufferBuilder, offset: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"finish",&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"Buffer",&local_171);
  IdlNamer::LegacyKotlinMethod((string *)local_128,&this->namer_,&local_148,struct_def,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"",&local_199);
  local_1d0.id = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
  local_1d0.writer = writer;
  std::function<void()>::
  function<flatbuffers::kotlin::KotlinKMPGenerator::GenerateFinishStructBuffer(flatbuffers::StructDef&,std::__cxx11::string_const&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_1_,void>
            ((function<void()> *)&local_1c0,&local_1d0);
  GenerateFunOneLine(writer,(string *)local_128,(string *)((long)&method_name.field_2 + 8),
                     &local_198,&local_1c0,(bool)(options->gen_jvmstatic & 1));
  std::function<void_()>::~function(&local_1c0);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)(method_name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void GenerateFinishStructBuffer(StructDef &struct_def,
                                  const std::string &identifier,
                                  CodeWriter &writer,
                                  const IDLOptions options) const {
    auto id = identifier.length() > 0 ? ", \"" + identifier + "\"" : "";
    auto gen_type = "Offset<" + namer_.Type(struct_def.name) + ">";
    auto params = "builder: FlatBufferBuilder, offset: " + gen_type;
    auto method_name =
        namer_.LegacyKotlinMethod("finish", struct_def, "Buffer");
    GenerateFunOneLine(
        writer, method_name, params, "",
        [&]() { writer += "builder.finish(offset" + id + ")"; },
        options.gen_jvmstatic);
  }